

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar6;
  char *pcVar7;
  undefined4 in_register_0000003c;
  long *plVar8;
  _Alloc_hider _Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_class_1_0_00000001 local_111;
  long *local_110;
  long *local_108;
  long local_100;
  long local_f8 [2];
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  long *local_c8;
  long local_c0;
  long local_b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  text local_88;
  text local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  plVar8 = (long *)CONCAT44(in_register_0000003c,__nfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar11 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,*plVar8,plVar8[1] + *plVar8);
    bVar3 = select::anon_class_1_0_00000001::operator()(&local_111,&local_68);
    uVar6 = (uint)CONCAT71(extraout_var,bVar3);
    _Var9._M_p = local_68._M_dataplus._M_p;
LAB_00114f9c:
    uVar6 = uVar6 ^ 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p != paVar11) {
      operator_delete(_Var9._M_p,paVar11->_M_allocated_capacity + 1);
    }
  }
  else if (__readfds->fds_bits[1] == __readfds->fds_bits[0]) {
LAB_00114ff5:
    uVar6 = 0;
  }
  else {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (__readfds->fds_bits[1] + -0x20);
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (this,"@");
    pcVar7 = (char *)CONCAT71((int7)((ulong)&local_48 >> 8),1);
    uVar6 = (uint)pcVar7;
    if (iVar4 != 0) {
      local_110 = local_b8;
      do {
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(this,"*");
        if (iVar4 == 0) break;
        pcVar2 = (this->_M_dataplus)._M_p;
        local_c8 = local_b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,pcVar2,pcVar2 + this->_M_string_length);
        local_e8 = local_d8;
        std::__cxx11::string::_M_construct<char*>((string *)&local_e8,*plVar8,plVar8[1] + *plVar8);
        _Var5 = std::
                __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<lest::search(std::__cxx11::string,std::__cxx11::string)::_lambda(char,char)_1_>>
                          (local_e8,local_e0 + (long)local_e8,local_c8,local_c0 + (long)local_c8);
        pcVar7 = (char *)(local_e0 + (long)local_e8);
        if (local_e8 != local_d8) {
          operator_delete(local_e8,local_d8[0] + 1);
        }
        if (local_c8 != local_b8) {
          operator_delete(local_c8,local_b8[0] + 1);
        }
        if (_Var5._M_current != pcVar7) break;
        cVar1 = *(this->_M_dataplus)._M_p;
        pcVar7 = (char *)CONCAT71((int7)((ulong)pcVar7 >> 8),cVar1);
        if (cVar1 == '!') {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_a8,this,1,0xffffffffffffffff);
          local_108 = local_f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,*plVar8,plVar8[1] + *plVar8);
          _Var5 = std::
                  __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<lest::search(std::__cxx11::string,std::__cxx11::string)::_lambda(char,char)_1_>>
                            (local_108,local_100 + (long)local_108,local_a8._M_dataplus._M_p,
                             local_a8._M_dataplus._M_p + local_a8._M_string_length);
          pcVar10 = (char *)(local_100 + (long)local_108);
          if (local_108 != local_f8) {
            operator_delete(local_108,local_f8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (_Var5._M_current != pcVar10) goto LAB_00114ff5;
          if (this == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __readfds->fds_bits[0]) {
            paVar11 = &local_88.field_2;
            local_88._M_dataplus._M_p = (pointer)paVar11;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,*plVar8,plVar8[1] + *plVar8);
            bVar3 = select::anon_class_1_0_00000001::operator()(&local_111,&local_88);
            uVar6 = (uint)CONCAT71(extraout_var_00,bVar3);
            _Var9._M_p = local_88._M_dataplus._M_p;
            goto LAB_00114f9c;
          }
        }
        else if (this == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __readfds->fds_bits[0]) goto LAB_00114ff5;
        this = this + -1;
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(this,"@");
      } while (iVar4 != 0);
      uVar6 = (uint)CONCAT71((int7)((ulong)pcVar7 >> 8),1);
    }
  }
  return uVar6;
}

Assistant:

inline bool select( text name, texts include )
{
    auto none = []( texts args ) { return args.size() == 0; };

#if lest_FEATURE_REGEX_SEARCH
    auto hidden = []( text arg ){ return match( { "\\[\\..*", "\\[hide\\]" }, arg ); };
#else
    auto hidden = []( text arg ){ return match( { "[.", "[hide]" }, arg ); };
#endif

    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( auto pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        auto & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}